

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings_manager.cc
# Opt level: O1

bool __thiscall xsettingsd::SettingsManager::LoadConfig(SettingsManager *this)

{
  bool bVar1;
  FileCharStream *this_00;
  char *pcVar2;
  SettingsMap new_settings;
  ConfigParser parser;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_xsettingsd::Setting_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_xsettingsd::Setting_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_xsettingsd::Setting_*>_>_>
  local_a0;
  ConfigParser local_70;
  string local_40;
  
  this_00 = (FileCharStream *)operator_new(0x40);
  ConfigParser::FileCharStream::FileCharStream(this_00,&this->config_filename_);
  ConfigParser::ConfigParser(&local_70,(CharStream *)this_00);
  local_a0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_a0._M_impl.super__Rb_tree_header._M_header;
  local_a0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_a0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_a0._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar1 = ConfigParser::Parse(&local_70,(SettingsMap *)&local_a0,&this->settings_,this->serial_ + 1)
  ;
  if (bVar1) {
    this->serial_ = this->serial_ + 1;
    pcVar2 = "s";
    if (local_a0._M_impl.super__Rb_tree_header._M_node_count == 1) {
      pcVar2 = "";
    }
    fprintf(_stderr,"%s: Loaded %zu setting%s from %s\n",kProgName,
            local_a0._M_impl.super__Rb_tree_header._M_node_count,pcVar2,
            (this->config_filename_)._M_dataplus._M_p);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_xsettingsd::Setting_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_xsettingsd::Setting_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_xsettingsd::Setting_*>_>_>
    ::swap((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_xsettingsd::Setting_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_xsettingsd::Setting_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_xsettingsd::Setting_*>_>_>
            *)&this->settings_,&local_a0);
  }
  else {
    ConfigParser::FormatError_abi_cxx11_(&local_40,&local_70);
    LoadConfig();
  }
  SettingsMap::~SettingsMap((SettingsMap *)&local_a0);
  ConfigParser::~ConfigParser(&local_70);
  return bVar1;
}

Assistant:

bool SettingsManager::LoadConfig() {
  ConfigParser parser(new ConfigParser::FileCharStream(config_filename_));
  SettingsMap new_settings;
  if (!parser.Parse(&new_settings, &settings_, serial_ + 1)) {
    fprintf(stderr, "%s: Unable to parse %s: %s\n",
            kProgName, config_filename_.c_str(), parser.FormatError().c_str());
    return false;
  }
  serial_++;
  fprintf(stderr, "%s: Loaded %zu setting%s from %s\n",
          kProgName, new_settings.map().size(),
          (new_settings.map().size() == 1) ? "" : "s",
          config_filename_.c_str());
  settings_.swap(&new_settings);
  return true;
}